

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::HierarchicalValueExpression>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          HierarchicalValueExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  HierarchicalValueExpression *in_stack_00000038;
  CheckerMemberVisitor *in_stack_00000040;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    CheckerMemberVisitor::handle(in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }